

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void kwssys::SystemTools::CheckTranslationPath(string *path)

{
  _Rb_tree_node_base *p_Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  
  if (1 < path->_M_string_length) {
    std::__cxx11::string::push_back((char)path);
    p_Var3 = (_Rb_tree_node_base *)(SystemToolsStatics + 8);
    for (p_Var1 = *(_Rb_tree_node_base **)(SystemToolsStatics + 0x18); p_Var1 != p_Var3;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      iVar2 = std::__cxx11::string::compare((ulong)path,0,(string *)p_Var1[1]._M_parent);
      if (iVar2 == 0) {
        std::__cxx11::string::replace
                  ((ulong)path,0,(char *)p_Var1[1]._M_parent,*(ulong *)(p_Var1 + 2));
        std::__cxx11::string::_M_assign((string *)path);
      }
    }
    std::__cxx11::string::pop_back();
    return;
  }
  return;
}

Assistant:

void SystemTools::CheckTranslationPath(std::string& path)
{
  // Do not translate paths that are too short to have meaningful
  // translations.
  if (path.size() < 2) {
    return;
  }

  // Always add a trailing slash before translation.  It does not
  // matter if this adds an extra slash, but we do not want to
  // translate part of a directory (like the foo part of foo-dir).
  path += '/';

  // In case a file was specified we still have to go through this:
  // Now convert any path found in the table back to the one desired:
  for (auto const& pair : SystemToolsStatics->TranslationMap) {
    // We need to check of the path is a substring of the other path
    if (path.compare(0, pair.first.size(), pair.first) == 0) {
      path = path.replace(0, pair.first.size(), pair.second);
    }
  }

  // Remove the trailing slash we added before.
  path.pop_back();
}